

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.c
# Opt level: O3

distance_t metric_soft_distance_quadratic(uint hard_x,uint8_t *soft_y,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (len != 0) {
    uVar1 = 1;
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar4 = hard_x & 1;
      if (uVar4 != 0) {
        uVar4 = 0xff01;
      }
      hard_x = hard_x >> 1;
      uVar2 = uVar2 + (soft_y[uVar3] + uVar4) * (soft_y[uVar3] + uVar4);
      uVar3 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar3 < len);
    return (distance_t)((uVar2 & 0xffff) >> 3);
  }
  return 0;
}

Assistant:

distance_t metric_soft_distance_quadratic(unsigned int hard_x, const uint8_t *soft_y, size_t len) {
    distance_t dist = 0;
    for (unsigned int i = 0; i < len; i++) {
        // first, convert hard_x to a soft measurement (0 -> 0, 1 - > 255)
        unsigned int soft_x = (hard_x & 1) ? 255 : 0;
        hard_x >>= 1;
        int d = soft_y[i] - soft_x;
        dist += d*d;
    }
    return dist >> 3;
}